

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O0

void Nwk_ManDfsReverse_rec(Nwk_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  bool bVar3;
  int nTerms;
  int iTerm1;
  int iBox;
  int i;
  Nwk_Obj_t *pNext;
  Vec_Ptr_t *vNodes_local;
  Nwk_Obj_t *pObj_local;
  
  iVar1 = Nwk_ObjIsTravIdCurrent(pObj);
  if (iVar1 == 0) {
    Nwk_ObjSetTravIdCurrent(pObj);
    iVar1 = Nwk_ObjIsCo(pObj);
    if (iVar1 == 0) {
      iVar1 = Nwk_ObjIsNode(pObj);
      if ((iVar1 == 0) && (iVar1 = Nwk_ObjIsCi(pObj), iVar1 == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/nwk/nwkDfs.c"
                      ,0x1b4,"void Nwk_ManDfsReverse_rec(Nwk_Obj_t *, Vec_Ptr_t *)");
      }
      iTerm1 = 0;
      while( true ) {
        bVar3 = false;
        if (iTerm1 < pObj->nFanouts) {
          _iBox = pObj->pFanio[pObj->nFanins + iTerm1];
          bVar3 = _iBox != (Nwk_Obj_t *)0x0;
        }
        if (!bVar3) break;
        Nwk_ManDfsReverse_rec(_iBox,vNodes);
        iTerm1 = iTerm1 + 1;
      }
    }
    else if ((pObj->pMan->pManTime != (Tim_Man_t *)0x0) &&
            (iVar1 = Tim_ManBoxForCo(pObj->pMan->pManTime,*(uint *)&pObj->field_0x20 >> 7),
            -1 < iVar1)) {
      iVar2 = Tim_ManBoxOutputFirst(pObj->pMan->pManTime,iVar1);
      iVar1 = Tim_ManBoxOutputNum(pObj->pMan->pManTime,iVar1);
      for (iTerm1 = 0; iTerm1 < iVar1; iTerm1 = iTerm1 + 1) {
        pObj_00 = Nwk_ManCi(pObj->pMan,iVar2 + iTerm1);
        Nwk_ManDfsReverse_rec(pObj_00,vNodes);
      }
    }
    Vec_PtrPush(vNodes,pObj);
  }
  return;
}

Assistant:

void Nwk_ManDfsReverse_rec( Nwk_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    Nwk_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms;
    if ( Nwk_ObjIsTravIdCurrent( pObj ) )
        return;
    Nwk_ObjSetTravIdCurrent( pObj );
    if ( Nwk_ObjIsCo(pObj) )
    {
        if ( pObj->pMan->pManTime )
        {
            iBox = Tim_ManBoxForCo( pObj->pMan->pManTime, pObj->PioId );
            if ( iBox >= 0 ) // this is not a true PO
            {
                iTerm1 = Tim_ManBoxOutputFirst( pObj->pMan->pManTime, iBox );
                nTerms = Tim_ManBoxOutputNum( pObj->pMan->pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Nwk_ManCi(pObj->pMan, iTerm1 + i);
                    Nwk_ManDfsReverse_rec( pNext, vNodes );
                }
            }
        }
    }
    else if ( Nwk_ObjIsNode(pObj) || Nwk_ObjIsCi(pObj) )
    {
        Nwk_ObjForEachFanout( pObj, pNext, i )
            Nwk_ManDfsReverse_rec( pNext, vNodes );
    }
    else
        assert( 0 );
    Vec_PtrPush( vNodes, pObj );
}